

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.cc
# Opt level: O3

int ECDH_compute_key(void *out,size_t outlen,EC_POINT *pub_key,EC_KEY *ecdh,KDF *KDF)

{
  long lVar1;
  int iVar2;
  EC_GROUP *group;
  void *pvVar3;
  int lib;
  int line;
  size_t buf_len;
  uint8_t buf [66];
  EC_JACOBIAN shared_point;
  ulong local_168;
  ulong local_160;
  uint8_t local_158 [80];
  EC_JACOBIAN local_108;
  
  lVar1 = *(long *)(ecdh + 0x10);
  local_168 = outlen;
  if (lVar1 == 0) {
    lib = 0x1b;
    iVar2 = 0x65;
    line = 0x22;
  }
  else {
    group = (EC_GROUP *)EC_KEY_get0_group(ecdh);
    iVar2 = EC_GROUP_cmp((EC_GROUP *)group,*(EC_GROUP **)pub_key,(BN_CTX *)0x0);
    if (iVar2 == 0) {
      iVar2 = ec_point_mul_scalar(group,&local_108,(EC_JACOBIAN *)(pub_key + 8),
                                  (EC_SCALAR *)(lVar1 + 0x18));
      if ((iVar2 == 0) ||
         (iVar2 = ec_get_x_coordinate_as_bytes(group,local_158,&local_160,0x42,&local_108),
         iVar2 == 0)) {
        lib = 0x1b;
        iVar2 = 0x66;
        line = 0x32;
      }
      else {
        if (KDF == (KDF *)0x0) {
          if (local_160 < outlen) {
            local_168 = local_160;
            outlen = local_160;
          }
          if (outlen == 0) {
            outlen = 0;
            goto LAB_00212525;
          }
          memcpy(out,local_158,outlen);
        }
        else {
          pvVar3 = (*KDF)(local_158,local_160,out,&local_168);
          outlen = local_168;
          if (pvVar3 == (void *)0x0) {
            lib = 0x1b;
            iVar2 = 100;
            line = 0x38;
            goto LAB_0021251b;
          }
        }
        if (outlen >> 0x1f == 0) goto LAB_00212525;
        lib = 0x1b;
        iVar2 = 0x45;
        line = 0x44;
      }
    }
    else {
      lib = 0xf;
      iVar2 = 0x6a;
      line = 0x28;
    }
  }
LAB_0021251b:
  ERR_put_error(lib,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdh/ecdh.cc"
                ,line);
  outlen = 0xffffffff;
LAB_00212525:
  return (int)outlen;
}

Assistant:

int ECDH_compute_key(void *out, size_t out_len, const EC_POINT *pub_key,
                     const EC_KEY *priv_key,
                     void *(*kdf)(const void *in, size_t inlen, void *out,
                                  size_t *out_len)) {
  if (priv_key->priv_key == NULL) {
    OPENSSL_PUT_ERROR(ECDH, ECDH_R_NO_PRIVATE_VALUE);
    return -1;
  }
  const EC_SCALAR *const priv = &priv_key->priv_key->scalar;
  const EC_GROUP *const group = EC_KEY_get0_group(priv_key);
  if (EC_GROUP_cmp(group, pub_key->group, NULL) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_INCOMPATIBLE_OBJECTS);
    return -1;
  }

  EC_JACOBIAN shared_point;
  uint8_t buf[EC_MAX_BYTES];
  size_t buf_len;
  if (!ec_point_mul_scalar(group, &shared_point, &pub_key->raw, priv) ||
      !ec_get_x_coordinate_as_bytes(group, buf, &buf_len, sizeof(buf),
                                    &shared_point)) {
    OPENSSL_PUT_ERROR(ECDH, ECDH_R_POINT_ARITHMETIC_FAILURE);
    return -1;
  }

  if (kdf != NULL) {
    if (kdf(buf, buf_len, out, &out_len) == NULL) {
      OPENSSL_PUT_ERROR(ECDH, ECDH_R_KDF_FAILED);
      return -1;
    }
  } else {
    // no KDF, just copy as much as we can
    if (buf_len < out_len) {
      out_len = buf_len;
    }
    OPENSSL_memcpy(out, buf, out_len);
  }

  if (out_len > INT_MAX) {
    OPENSSL_PUT_ERROR(ECDH, ERR_R_OVERFLOW);
    return -1;
  }

  return (int)out_len;
}